

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functions.h
# Opt level: O2

float math::fastpow<float>(float *base,uint exp)

{
  uint uVar1;
  float fVar2;
  
  fVar2 = *base;
  if (exp == 0) {
    fVar2 = 1.0;
  }
  for (uVar1 = 1; uVar1 <= exp >> 1; uVar1 = uVar1 * 2) {
    fVar2 = fVar2 * fVar2;
  }
  for (; uVar1 < exp; uVar1 = uVar1 + 1) {
    fVar2 = fVar2 * *base;
  }
  return fVar2;
}

Assistant:

T
fastpow (T const& base, unsigned int exp)
{
    T ret = (exp == 0 ? T(1) : base);
    unsigned int const exp2 = exp / 2;
    unsigned int i = 1;
    for (; i <= exp2; i = i * 2)
        ret = ret * ret;
    for (; i < exp; ++i)
        ret = ret * base;
    return ret;
}